

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.h
# Opt level: O2

pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> __thiscall
booster::aio::buffer_impl<const_char_*>::get(buffer_impl<const_char_*> *this)

{
  pointer peVar1;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar2;
  pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long> pVar3;
  
  if (this->size_ == 0) {
    return (pair<const_booster::aio::buffer_impl<const_char_*>::entry_*,_unsigned_long>)
           (ZEXT416(0) << 0x40);
  }
  if (this->size_ == 1) {
    pVar2.first = &this->entry_;
    pVar2.second = 1;
    return pVar2;
  }
  peVar1 = (this->vec_).
           super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVar3.second = (long)(this->vec_).
                       super__Vector_base<booster::aio::buffer_impl<const_char_*>::entry,_std::allocator<booster::aio::buffer_impl<const_char_*>::entry>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)peVar1 >> 4;
  pVar3.first = peVar1;
  return pVar3;
}

Assistant:

std::pair<entry const *,size_t> get() const
			{
				if(size_ == 0) {
					buffer_data_type bt;
					bt.first=0;
					bt.second=0;
					return bt;
				}
				else if(size_ == 1)
					return buffer_data_type(&entry_,1);
				else
					return buffer_data_type(&vec_.front(),vec_.size());
			}